

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpDisassemble::OnBrTableExpr
          (BinaryReaderObjdumpDisassemble *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  Offset OVar1;
  Offset OVar2;
  char *pcVar3;
  ulong uVar4;
  string buffer;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  
  OVar1 = this->current_opcode_offset;
  OVar2 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
          state)->offset;
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  for (uVar4 = 0; num_targets != uVar4; uVar4 = uVar4 + 1) {
    std::__cxx11::to_string(&local_50,target_depths[uVar4]);
    pcVar3 = (char *)std::__cxx11::string::append((string *)&local_70);
    std::__cxx11::string::append(pcVar3);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::to_string(&local_50,default_target_depth);
  std::__cxx11::string::append((string *)&local_70);
  std::__cxx11::string::_M_dispose();
  LogOpcode(this,OVar2 - OVar1,"%s",local_70);
  std::__cxx11::string::_M_dispose();
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnBrTableExpr(
    Index num_targets,
    Index* target_depths,
    Index default_target_depth) {
  Offset immediate_len = state->offset - current_opcode_offset;

  std::string buffer = std::string();
  for (Index i = 0; i < num_targets; i++) {
    buffer.append(std::to_string(target_depths[i])).append(" ");
  }
  buffer.append(std::to_string(default_target_depth));

  LogOpcode(immediate_len, "%s", buffer.c_str());
  return Result::Ok;
}